

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  uint flag;
  uint uVar1;
  State *pSVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Workq *pWVar6;
  bool bVar7;
  Workq *pWVar8;
  byte bVar9;
  bool bVar10;
  bool ismatch;
  LogMessage local_1a8;
  
  if (state < (State *)0x3) {
    if (state == (State *)0x0) {
      LogMessage::LogMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x3dc
                 ,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8.str_,"NULL state in RunStateOnByte",0x1c);
    }
    else {
      if (state == (State *)0x2) {
        return (State *)0x2;
      }
      if (state == (State *)0x1) {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x3d8,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8.str_,"DeadState in RunStateOnByte",0x1b);
      }
      else {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x3df,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8.str_,"Unexpected special state in RunStateOnByte",0x2a);
      }
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    pSVar2 = (State *)0x0;
  }
  else {
    if (c == 0x100) {
      uVar4 = this->prog_->bytemap_range_;
    }
    else {
      uVar4 = (uint)this->prog_->bytemap_[c];
    }
    pSVar2 = (State *)(&state[1].inst_)[(int)uVar4];
    if (pSVar2 == (State *)0x0) {
      StateToWorkq(this,state,this->q0_);
      uVar4 = state->flag_;
      uVar5 = uVar4 & 0xfff;
      bVar10 = c == 10;
      uVar3 = uVar5 | 2;
      if (!bVar10) {
        uVar3 = uVar5;
      }
      if (c == 0x100) {
        bVar7 = false;
        uVar3 = uVar3 | 10;
      }
      else {
        bVar9 = (byte)c;
        bVar7 = (bVar9 == 0x5f || (byte)(bVar9 - 0x30) < 10) || (byte)((bVar9 & 0xdf) + 0xbf) < 0x1a
        ;
      }
      uVar3 = (uint)(byte)((uVar4 >> 0xd & 1) == 0 ^ bVar7) * 0x10 + 0x10 | uVar3;
      pWVar8 = this->q0_;
      pWVar6 = this->q1_;
      if ((uVar4 >> 0x10 & ~uVar5 & uVar3) != 0) {
        RunWorkqOnEmptyString(this,pWVar8,pWVar6,uVar3);
        pWVar6 = this->q0_;
        pWVar8 = this->q1_;
        this->q0_ = pWVar8;
        this->q1_ = pWVar6;
      }
      local_1a8.severity_._0_1_ = '\0';
      RunWorkqOnByte(this,pWVar8,pWVar6,c,(uint)bVar10,(bool *)&local_1a8,this->kind_);
      pWVar8 = this->q0_;
      if ((c != 0x100) || (pWVar6 = pWVar8, this->kind_ != kManyMatch)) {
        pWVar6 = this->q1_;
        this->q0_ = pWVar6;
        this->q1_ = pWVar8;
      }
      uVar1 = bVar10 + 0x1000;
      if ((char)local_1a8.severity_ == '\0') {
        uVar1 = (uint)bVar10;
      }
      flag = uVar1 + 0x2000;
      if (bVar7 == false) {
        flag = uVar1;
      }
      pSVar2 = WorkqToCachedState(this,pWVar6,flag);
      if (c == 0x100) {
        uVar4 = this->prog_->bytemap_range_;
      }
      else {
        uVar4 = (uint)this->prog_->bytemap_[c];
      }
      (&state[1].inst_)[(int)uVar4] = (int *)pSVar2;
    }
  }
  return pSVar2;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();
  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint needflag = state->flag_ >> kFlagNeedShift;
  uint beforeflag = state->flag_ & kFlagEmptyMask;
  uint oldbeforeflag = beforeflag;
  uint afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = (c != kByteEndText && Prog::IsWordChar(static_cast<uint8>(c)));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch, kind_);

  // Most of the time, we build the state from the output of
  // RunWorkqOnByte, so swap q0_ and q1_ here.  However, so that
  // RE2::Set can tell exactly which match instructions
  // contributed to the match, don't swap if c is kByteEndText.
  // The resulting state wouldn't be correct for further processing
  // of the string, but we're at the end of the text so that's okay.
  // Leaving q0_ alone preseves the match instructions that led to
  // the current setting of ismatch.
  if (c != kByteEndText || kind_ != Prog::kManyMatch)
    swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  ns = WorkqToCachedState(q0_, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}